

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

char * anon_unknown.dwarf_be1894::getShapeForTarget(cmGeneratorTarget *target)

{
  TargetType TVar1;
  cmGeneratorTarget *target_local;
  
  if (target == (cmGeneratorTarget *)0x0) {
    target_local = (cmGeneratorTarget *)anon_var_dwarf_be1a07;
  }
  else {
    TVar1 = cmGeneratorTarget::GetType(target);
    switch(TVar1) {
    case EXECUTABLE:
      target_local = (cmGeneratorTarget *)anon_var_dwarf_be1a12;
      break;
    case STATIC_LIBRARY:
      target_local = (cmGeneratorTarget *)anon_var_dwarf_be1a1d;
      break;
    case SHARED_LIBRARY:
      target_local = (cmGeneratorTarget *)anon_var_dwarf_be1a28;
      break;
    case MODULE_LIBRARY:
      target_local = (cmGeneratorTarget *)anon_var_dwarf_be1a33;
      break;
    default:
      target_local = (cmGeneratorTarget *)anon_var_dwarf_be1a3e;
    }
  }
  return (char *)target_local;
}

Assistant:

const char* getShapeForTarget(const cmGeneratorTarget* target)
{
  if (!target) {
    return "ellipse";
  }

  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      return "house";
    case cmStateEnums::STATIC_LIBRARY:
      return "diamond";
    case cmStateEnums::SHARED_LIBRARY:
      return "polygon";
    case cmStateEnums::MODULE_LIBRARY:
      return "octagon";
    default:
      break;
  }

  return "box";
}